

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void accountingReportDiff
               (XML_Parser rootParser,uint levelsAwayFromRootParser,char *before,char *after,
               ptrdiff_t bytesMore,int source_line,XML_Account account)

{
  FILE *pFVar1;
  char *pcVar2;
  uchar *local_58;
  char *walker;
  uint contextLength;
  size_t ellipsisLength;
  undefined1 local_35;
  undefined1 auStack_34 [3];
  char ellipis [5];
  int source_line_local;
  ptrdiff_t bytesMore_local;
  char *after_local;
  char *before_local;
  uint levelsAwayFromRootParser_local;
  XML_Parser rootParser_local;
  
  _auStack_34 = source_line;
  unique0x100001c9 = bytesMore;
  if (rootParser->m_parentParser != (XML_Parser)0x0) {
    __assert_fail("! rootParser->m_parentParser",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/expat/xmlparse.c"
                  ,0x1eb8,
                  "void accountingReportDiff(XML_Parser, unsigned int, const char *, const char *, ptrdiff_t, int, enum XML_Account)"
                 );
  }
  pcVar2 = "EXP";
  if (account == XML_ACCOUNT_DIRECT) {
    pcVar2 = "DIR";
  }
  fprintf(_stderr," (+%6ld bytes %s|%u, xmlparse.c:%d) %*s\"",bytesMore,pcVar2,
          (ulong)levelsAwayFromRootParser,(ulong)(uint)source_line,10,"");
  stack0xffffffffffffffc7 = 0x5d2e2e5b;
  local_35 = 0;
  local_58 = (uchar *)before;
  if (((rootParser->m_accounting).debugLevel < 3) && (0x18 < (long)after - (long)before)) {
    for (; pFVar1 = _stderr, local_58 < before + 10; local_58 = local_58 + 1) {
      pcVar2 = coda_unsignedCharToPrintable(*local_58);
      fprintf(pFVar1,"%s",pcVar2);
    }
    fprintf(_stderr,(char *)((long)&ellipsisLength + 7));
    for (local_58 = (uchar *)(after + -10); pFVar1 = _stderr, local_58 < after;
        local_58 = local_58 + 1) {
      pcVar2 = coda_unsignedCharToPrintable(*local_58);
      fprintf(pFVar1,"%s",pcVar2);
    }
  }
  else {
    for (; pFVar1 = _stderr, local_58 < after; local_58 = local_58 + 1) {
      pcVar2 = coda_unsignedCharToPrintable(*local_58);
      fprintf(pFVar1,"%s",pcVar2);
    }
  }
  fprintf(_stderr,"\"\n");
  return;
}

Assistant:

static void
accountingReportDiff(XML_Parser rootParser,
                     unsigned int levelsAwayFromRootParser, const char *before,
                     const char *after, ptrdiff_t bytesMore, int source_line,
                     enum XML_Account account) {
  assert(! rootParser->m_parentParser);

  fprintf(stderr,
          " (+" EXPAT_FMT_PTRDIFF_T("6") " bytes %s|%u, xmlparse.c:%d) %*s\"",
          bytesMore, (account == XML_ACCOUNT_DIRECT) ? "DIR" : "EXP",
          levelsAwayFromRootParser, source_line, 10, "");

  const char ellipis[] = "[..]";
  const size_t ellipsisLength = sizeof(ellipis) /* because compile-time */ - 1;
  const unsigned int contextLength = 10;

  /* Note: Performance is of no concern here */
  const char *walker = before;
  if ((rootParser->m_accounting.debugLevel >= 3u)
      || (after - before)
             <= (ptrdiff_t)(contextLength + ellipsisLength + contextLength)) {
    for (; walker < after; walker++) {
      fprintf(stderr, "%s", unsignedCharToPrintable(walker[0]));
    }
  } else {
    for (; walker < before + contextLength; walker++) {
      fprintf(stderr, "%s", unsignedCharToPrintable(walker[0]));
    }
    fprintf(stderr, ellipis);
    walker = after - contextLength;
    for (; walker < after; walker++) {
      fprintf(stderr, "%s", unsignedCharToPrintable(walker[0]));
    }
  }
  fprintf(stderr, "\"\n");
}